

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.c
# Opt level: O1

tchar_t * GetProtocol(tchar_t *URL,tchar_t *Proto,int ProtoLen,bool_t *HasHost)

{
  int iVar1;
  char *pcVar2;
  bool_t bVar3;
  ulong uVar4;
  
  pcVar2 = strchr(URL,0x3a);
  if (((pcVar2 == (char *)0x0) || (pcVar2[1] != '/')) || (pcVar2[2] != '/')) {
    if (HasHost != (bool_t *)0x0) {
      *HasHost = 0;
    }
    if (Proto == (tchar_t *)0x0) {
      return URL;
    }
    tcscpy_s(Proto,(long)ProtoLen,"file");
    return URL;
  }
  if (URL < pcVar2) {
    do {
      bVar3 = IsSpace((int)*URL);
      if (bVar3 == 0) break;
      URL = URL + 1;
    } while (URL != pcVar2);
  }
  if (Proto != (tchar_t *)0x0) {
    tcsncpy_s(Proto,(long)ProtoLen,URL,(long)pcVar2 - (long)URL);
  }
  if (HasHost != (bool_t *)0x0) {
    iVar1 = tcsnicmp(URL,"file",4);
    if ((((iVar1 == 0) || (iVar1 = tcsnicmp(URL,"conf",3), iVar1 == 0)) ||
        ((iVar1 = tcsnicmp(URL,"res",3), iVar1 == 0 ||
         ((iVar1 = tcsnicmp(URL,"root",4), iVar1 == 0 || (iVar1 = tcsnicmp(URL,"mem",3), iVar1 == 0)
          ))))) ||
       ((iVar1 = tcsnicmp(URL,"pose",4), iVar1 == 0 ||
        ((((iVar1 = tcsnicmp(URL,"vol",3), iVar1 == 0 ||
           (iVar1 = tcsnicmp(URL,"slot",4), iVar1 == 0)) ||
          (iVar1 = tcsnicmp(URL,"simu",4), iVar1 == 0)) ||
         (iVar1 = tcsnicmp(URL,"local",5), iVar1 == 0)))))) {
      uVar4 = 0;
    }
    else {
      iVar1 = tcsnicmp(URL,"sdcard",6);
      uVar4 = (ulong)(iVar1 != 0);
    }
    *HasHost = uVar4;
  }
  return pcVar2 + 3;
}

Assistant:

const tchar_t* GetProtocol(const tchar_t* URL, tchar_t* Proto, int ProtoLen, bool_t* HasHost)
{
    const tchar_t* s = tcschr(URL,':');
    if (s && s[1] == '/' && s[2] == '/')
    {
        while (URL<s && IsSpace(*URL)) ++URL;
        if (Proto)
            tcsncpy_s(Proto,ProtoLen,URL,s-URL);
        if (HasHost)
        {
            *HasHost = tcsnicmp(URL,T("file"),4)!=0 &&
                       tcsnicmp(URL,T("conf"),3)!=0 &&
                       tcsnicmp(URL,T("res"),3)!=0 &&
                       tcsnicmp(URL,T("root"),4)!=0 &&
                       tcsnicmp(URL,T("mem"),3)!=0 &&
                       tcsnicmp(URL,T("pose"),4)!=0 &&
                       tcsnicmp(URL,T("vol"),3)!=0 &&
                       tcsnicmp(URL,T("slot"),4)!=0 &&
                       tcsnicmp(URL,T("simu"),4)!=0 &&
                       tcsnicmp(URL,T("local"),5)!=0 &&
                       tcsnicmp(URL,T("sdcard"),6)!=0;
        }
        s += 3;
    }
    else
    {
        if (HasHost)
            *HasHost = 0;
        if (Proto)
            tcscpy_s(Proto,ProtoLen,T("file"));
        s = URL;
    }
    return s;
}